

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O0

s32 __thiscall irr::gui::CGUIListBox::getItemAt(CGUIListBox *this,s32 xpos,s32 ypos)

{
  int iVar1;
  int iVar2;
  u32 uVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  s32 item;
  int local_4;
  
  if ((((in_ESI < *(int *)(in_RDI + 0x40)) || (*(int *)(in_RDI + 0x48) <= in_ESI)) ||
      (in_EDX < *(int *)(in_RDI + 0x44))) || (*(int *)(in_RDI + 0x4c) <= in_EDX)) {
    local_4 = -1;
  }
  else if (*(int *)(in_RDI + 0x15c) == 0) {
    local_4 = -1;
  }
  else {
    iVar1 = *(int *)(in_RDI + 0x44);
    iVar2 = (**(code **)(**(long **)(in_RDI + 0x180) + 0x160))();
    local_4 = ((in_EDX - iVar1) + -1 + iVar2) / *(int *)(in_RDI + 0x15c);
    if ((local_4 < 0) ||
       (uVar3 = core::array<irr::gui::CGUIListBox::ListItem>::size
                          ((array<irr::gui::CGUIListBox::ListItem> *)0x3c116e),
       (int)uVar3 <= local_4)) {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

s32 CGUIListBox::getItemAt(s32 xpos, s32 ypos) const
{
	if (xpos < AbsoluteRect.UpperLeftCorner.X || xpos >= AbsoluteRect.LowerRightCorner.X || ypos < AbsoluteRect.UpperLeftCorner.Y || ypos >= AbsoluteRect.LowerRightCorner.Y)
		return -1;

	if (ItemHeight == 0)
		return -1;

	s32 item = ((ypos - AbsoluteRect.UpperLeftCorner.Y - 1) + ScrollBar->getPos()) / ItemHeight;
	if (item < 0 || item >= (s32)Items.size())
		return -1;

	return item;
}